

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPClause::generateDOT
          (OpenMPClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  OpenMPDirective *this_00;
  char *pcVar3;
  OpenMPClause *pOVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_t sVar9;
  size_type *psVar10;
  ulong *puVar11;
  long *plVar12;
  ulong uVar13;
  pointer ppcVar14;
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  string __str_3;
  string expr_name;
  string clause_kind;
  string current_line;
  string indent;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string clause_label;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ofstream *local_1d0;
  ulong *local_1c8;
  undefined8 local_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  char *local_180;
  undefined8 local_178;
  char local_170;
  undefined7 uStack_16f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0 [2];
  long local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  string *local_80;
  OpenMPClause *local_78;
  string local_70;
  string local_50;
  
  local_180 = &local_170;
  local_178 = 0;
  local_170 = '\0';
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_1d0 = dot_file;
  local_80 = parent_node;
  std::__cxx11::string::_M_construct((ulong)&local_140,(char)depth);
  local_78 = this;
  switch(this->kind) {
  case OMPC_if:
    break;
  case OMPC_num_threads:
    break;
  case OMPC_default:
    break;
  case OMPC_private:
    break;
  case OMPC_firstprivate:
    break;
  case OMPC_shared:
    break;
  default:
    puts("The clause enum is not supported yet.");
    goto LAB_0015e3e7;
  case OMPC_align:
    break;
  case OMPC_proc_bind:
    break;
  case OMPC_allocate:
    break;
  case OMPC_num_teams:
    break;
  case OMPC_thread_limit:
    break;
  case OMPC_collapse:
    break;
  case OMPC_ordered:
    break;
  case OMPC_nowait:
    break;
  case OMPC_order:
    break;
  case OMPC_safelen:
    break;
  case OMPC_simdlen:
    break;
  case OMPC_aligned:
    break;
  case OMPC_nontemporal:
    break;
  case OMPC_uniform:
    break;
  case OMPC_inbranch:
    break;
  case OMPC_notinbranch:
    break;
  case OMPC_bind:
    break;
  case OMPC_inclusive:
    break;
  case OMPC_exclusive:
    break;
  case OMPC_copyprivate:
    break;
  case OMPC_parallel:
    break;
  case OMPC_sections:
    break;
  case OMPC_for:
    break;
  case OMPC_do:
    break;
  case OMPC_taskgroup:
    break;
  case OMPC_initializer:
    break;
  case OMPC_final:
    break;
  case OMPC_untied:
    break;
  case OMPC_mergeable:
    break;
  case OMPC_priority:
    break;
  case OMPC_detach:
    break;
  case OMPC_grainsize:
    break;
  case OMPC_num_tasks:
    break;
  case OMPC_nogroup:
    break;
  case OMPC_reverse_offload:
    break;
  case OMPC_unified_address:
    break;
  case OMPC_unified_shared_memory:
    break;
  case OMPC_dynamic_allocators:
    break;
  case OMPC_map:
    break;
  case OMPC_use_device_ptr:
    break;
  case OMPC_use_device_addr:
    break;
  case OMPC_is_device_ptr:
    break;
  case OMPC_has_device_addr:
    break;
  case OMPC_uses_allocators:
    break;
  case OMPC_link:
    break;
  case OMPC_device_type:
    break;
  case OMPC_acq_rel:
    break;
  case OMPC_release:
    break;
  case OMPC_acquire:
    break;
  case OMPC_read:
    break;
  case OMPC_write:
    break;
  case OMPC_update:
    break;
  case OMPC_capture:
    break;
  case OMPC_seq_cst:
    break;
  case OMPC_relaxed:
    break;
  case OMPC_hint:
    break;
  case OMPC_destroy:
    break;
  case OMPC_threads:
    break;
  case OMPC_simd:
  }
  std::__cxx11::string::append((char *)&local_1a8);
LAB_0015e3e7:
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
  local_e0 = &local_d0;
  pcVar2 = (local_80->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar2,pcVar2 + local_80->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_1a8._M_dataplus._M_p);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160.field_2._8_8_ = plVar7[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_160._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_210.field_2._M_allocated_capacity = *puVar11;
    local_210.field_2._8_8_ = plVar7[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *puVar11;
    local_210._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_210._M_string_length = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar17 = -depth;
  if (0 < depth) {
    uVar17 = depth;
  }
  uVar16 = 1;
  if (9 < uVar17) {
    uVar13 = (ulong)uVar17;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar6 = (uint)uVar13;
      if (uVar6 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0015e575;
      }
      if (uVar6 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0015e575;
      }
      if (uVar6 < 10000) goto LAB_0015e575;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar6);
    uVar16 = uVar16 + 1;
  }
LAB_0015e575:
  local_100 = &local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar16 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_100),uVar16,uVar17);
  pOVar4 = local_78;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    uVar15 = local_210.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_f8 + local_210._M_string_length) {
    uVar13 = 0xf;
    if (local_100 != &local_f0) {
      uVar13 = local_f0;
    }
    if (uVar13 < local_f8 + local_210._M_string_length) goto LAB_0015e607;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_100,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
  }
  else {
LAB_0015e607:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_100);
  }
  local_230 = &local_220;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_220 = *puVar11;
    lStack_218 = puVar8[3];
  }
  else {
    local_220 = *puVar11;
    local_230 = (ulong *)*puVar8;
  }
  local_228 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_1f0 = &local_1e0;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1e0 = *puVar11;
    lStack_1d8 = plVar7[3];
  }
  else {
    local_1e0 = *puVar11;
    local_1f0 = (ulong *)*plVar7;
  }
  local_1e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar17 = -index;
  if (0 < index) {
    uVar17 = index;
  }
  uVar16 = 1;
  if (9 < uVar17) {
    uVar13 = (ulong)uVar17;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar6 = (uint)uVar13;
      if (uVar6 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0015e729;
      }
      if (uVar6 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0015e729;
      }
      if (uVar6 < 10000) goto LAB_0015e729;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar6);
    uVar16 = uVar16 + 1;
  }
LAB_0015e729:
  local_120 = local_110;
  std::__cxx11::string::_M_construct((ulong)&local_120,(char)uVar16 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)index >> 0x1f) + (long)local_120),uVar16,uVar17);
  uVar13 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar13 = local_1e0;
  }
  if (uVar13 < (ulong)(local_118 + local_1e8)) {
    uVar13 = 0xf;
    if (local_120 != local_110) {
      uVar13 = local_110[0];
    }
    if ((ulong)(local_118 + local_1e8) <= uVar13) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_1f0);
      goto LAB_0015e7db;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_120);
LAB_0015e7db:
  local_1c8 = &local_1b8;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_1b8 = *puVar11;
    uStack_1b0 = puVar8[3];
  }
  else {
    local_1b8 = *puVar11;
    local_1c8 = (ulong *)*puVar8;
  }
  local_1c0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  std::operator+(&local_210,&local_140,local_80);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_220 = *puVar11;
    lStack_218 = puVar8[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar11;
    local_230 = (ulong *)*puVar8;
  }
  local_228 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_1a8._M_dataplus._M_p);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1e0 = *puVar11;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar11;
    local_1f0 = (ulong *)*plVar7;
  }
  local_1e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_1b8 = *puVar11;
    uStack_1b0 = puVar8[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar11;
    local_1c8 = (ulong *)*puVar8;
  }
  local_1c0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_180;
  if (local_180 == (char *)0x0) {
    std::ios::clear((int)local_1d0 + (int)*(undefined8 *)(*(long *)local_1d0 + -0x18));
  }
  else {
    sVar9 = strlen(local_180);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar3,sVar9);
  }
  std::__cxx11::string::append((char *)&local_140);
  std::operator+(&local_210,&local_140,&local_1a8);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_220 = *puVar11;
    lStack_218 = puVar8[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar11;
    local_230 = (ulong *)*puVar8;
  }
  local_228 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_c0[0]);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1e0 = *puVar11;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar11;
    local_1f0 = (ulong *)*plVar7;
  }
  local_1e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_1b8 = *puVar11;
    uStack_1b0 = puVar8[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar11;
    local_1c8 = (ulong *)*puVar8;
  }
  local_1c0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_180;
  if (local_180 == (char *)0x0) {
    std::ios::clear((int)local_1d0 + (int)*(undefined8 *)(*(long *)local_1d0 + -0x18));
  }
  else {
    sVar9 = strlen(local_180);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar3,sVar9);
  }
  if ((pOVar4->kind == OMPC_default) &&
     (this_00 = *(OpenMPDirective **)&pOVar4[1].super_SourceLocation,
     this_00 != (OpenMPDirective *)0x0)) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    OpenMPDirective::generateDOT(this_00,local_1d0,depth + 1,0,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = local_1b8 & 0xffffffffffffff00;
  ppcVar14 = (pOVar4->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar14 !=
      (pOVar4->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar17 = 0;
    do {
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      std::__cxx11::string::append((char *)&local_230);
      uVar16 = 1;
      if (9 < uVar17) {
        uVar13 = (ulong)uVar17;
        uVar5 = 4;
        do {
          uVar16 = uVar5;
          uVar6 = (uint)uVar13;
          if (uVar6 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0015ee80;
          }
          if (uVar6 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0015ee80;
          }
          if (uVar6 < 10000) goto LAB_0015ee80;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar16 + 4;
        } while (99999 < uVar6);
        uVar16 = uVar16 + 1;
      }
LAB_0015ee80:
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_210,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_210._M_dataplus._M_p,uVar16,uVar17);
      uVar13 = 0xf;
      if (local_230 != &local_220) {
        uVar13 = local_220;
      }
      paVar1 = &local_210.field_2;
      if (uVar13 < local_210._M_string_length + local_228) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          uVar15 = local_210.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_210._M_string_length + local_228) goto LAB_0015eeec;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_230);
      }
      else {
LAB_0015eeec:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_230,(ulong)local_210._M_dataplus._M_p);
      }
      local_1f0 = &local_1e0;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_1e0 = *puVar11;
        lStack_1d8 = puVar8[3];
      }
      else {
        local_1e0 = *puVar11;
        local_1f0 = (ulong *)*puVar8;
      }
      local_1e8 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1f0);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      std::operator+(&local_160,&local_140,&local_1a8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_210.field_2._M_allocated_capacity = *psVar10;
        local_210.field_2._8_8_ = plVar7[3];
        local_210._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar10;
        local_210._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_210._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1c8);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_220 = *puVar11;
        lStack_218 = plVar7[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar11;
        local_230 = (ulong *)*plVar7;
      }
      local_228 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_1e0 = *puVar11;
        lStack_1d8 = plVar7[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *puVar11;
        local_1f0 = (ulong *)*plVar7;
      }
      local_1e8 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = local_180;
      if (local_180 == (char *)0x0) {
        std::ios::clear((int)local_1d0 + (int)*(undefined8 *)(*(long *)local_1d0 + -0x18));
      }
      else {
        sVar9 = strlen(local_180);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar3,sVar9);
      }
      local_120 = local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,local_140._M_dataplus._M_p,
                 local_140._M_dataplus._M_p + local_140._M_string_length);
      paVar1 = &local_210.field_2;
      std::__cxx11::string::append((char *)&local_120);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1c8);
      local_100 = &local_f0;
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_f0 = *puVar11;
        lStack_e8 = plVar7[3];
      }
      else {
        local_f0 = *puVar11;
        local_100 = (ulong *)*plVar7;
      }
      local_f8 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
      local_e0 = &local_d0;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_d0 = *plVar12;
        lStack_c8 = plVar7[3];
      }
      else {
        local_d0 = *plVar12;
        local_e0 = (long *)*plVar7;
      }
      local_d8 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_160.field_2._M_allocated_capacity = *psVar10;
        local_160.field_2._8_8_ = plVar7[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar10;
        local_160._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_160._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_210.field_2._M_allocated_capacity = *puVar11;
        local_210.field_2._8_8_ = plVar7[3];
        local_210._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar11;
        local_210._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_210._M_string_length = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,*ppcVar14,&local_181);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        uVar15 = local_210.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_98 + local_210._M_string_length) {
        uVar13 = 0xf;
        if (local_a0 != local_90) {
          uVar13 = local_90[0];
        }
        if (uVar13 < local_98 + local_210._M_string_length) goto LAB_0015f3d5;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_a0,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
      }
      else {
LAB_0015f3d5:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_a0);
      }
      local_230 = &local_220;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_220 = *puVar11;
        lStack_218 = puVar8[3];
      }
      else {
        local_220 = *puVar11;
        local_230 = (ulong *)*puVar8;
      }
      local_228 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_1e0 = *puVar11;
        lStack_1d8 = plVar7[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *puVar11;
        local_1f0 = (ulong *)*plVar7;
      }
      local_1e8 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if (local_120 != local_110) {
        operator_delete(local_120,local_110[0] + 1);
      }
      pcVar3 = local_180;
      if (local_180 == (char *)0x0) {
        std::ios::clear((int)local_1d0 + (int)*(undefined8 *)(*(long *)local_1d0 + -0x18));
      }
      else {
        sVar9 = strlen(local_180);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar3,sVar9);
      }
      uVar17 = uVar17 + 1;
      ppcVar14 = ppcVar14 + 1;
    } while (ppcVar14 !=
             (local_78->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  return;
}

Assistant:

void OpenMPClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string clause_kind;
    std::string indent = std::string(depth, '\t');

    switch (this->getKind()) {
        case OMPC_private:
            clause_kind += "private";
            break;
        case OMPC_firstprivate:
            clause_kind += "firstprivate";
            break;
        case OMPC_shared:
            clause_kind += "shared";
            break;
        case OMPC_initializer:
            clause_kind += "initializer";
            break;
        case OMPC_num_threads:
            clause_kind += "num_threads";
            break;
        case OMPC_align:
            clause_kind += "align";
            break;
        case OMPC_num_teams:
            clause_kind += "num_teams";
            break;
        case OMPC_thread_limit:
            clause_kind += "thread_limit";
            break;
        case OMPC_default:
            clause_kind += "default";
            break;
        case OMPC_collapse:
            clause_kind += "collapse";
            break;
        case OMPC_ordered:
            clause_kind += "ordered";
            break;
        case OMPC_nowait:
            clause_kind += "nowait";
            break;
        case OMPC_allocate:
            clause_kind += "allocate";
            break;
        case OMPC_order:
            clause_kind += "order";
            break;
        case OMPC_safelen:
            clause_kind += "safelen";
            break;
        case OMPC_simdlen:
            clause_kind += "simdlen";
            break;
        case OMPC_aligned:
            clause_kind += "aligned";
            break;
        case OMPC_nontemporal:
            clause_kind += "nontemporal";
            break;
        case OMPC_uniform:
            clause_kind += "uniform";
            break;
        case OMPC_inbranch:
            clause_kind += "inbranch";
            break;
        case OMPC_notinbranch:
            clause_kind += "notinbranch";
            break;
        case OMPC_proc_bind:
            clause_kind += "proc_bind";
            break;
        case OMPC_bind:
            clause_kind += "bind";
            break; 
        case OMPC_inclusive:
            clause_kind += "inclusive";
            break;        
        case OMPC_exclusive:
            clause_kind += "exclusive";
            break;
        case OMPC_copyprivate:
            clause_kind += "copyprivate";
            break;
        case OMPC_parallel:
            clause_kind += "parallel";
            break;
        case OMPC_sections:
            clause_kind += "sections";
            break;
        case OMPC_for:
            clause_kind += "for";
            break;
        case OMPC_do:
            clause_kind += "do";
            break;
        case OMPC_taskgroup:
            clause_kind += "taskgroup";
            break;
        case OMPC_if:
            clause_kind += "if";
            break;
        case OMPC_reverse_offload:
            clause_kind += "reverse_offload";
            break;
        case OMPC_unified_address:
            clause_kind += "unified_address";
            break;
        case OMPC_unified_shared_memory:
            clause_kind += "unified_shared_memory";
            break;
        case OMPC_dynamic_allocators:
            clause_kind += "dynamic_allocators";
            break;
        case OMPC_final:
            clause_kind += "final";
            break;
        case OMPC_untied:
            clause_kind += "untied";
            break;
        case OMPC_mergeable:
            clause_kind += "mergeable";
            break;
        case OMPC_priority:
            clause_kind += "priority";
            break;
        case OMPC_detach:
            clause_kind += "detach";
            break;
        case OMPC_grainsize:
            clause_kind += "grainsize";
            break;
        case OMPC_num_tasks:
            clause_kind += "num_tasks";
            break;
        case OMPC_nogroup:
            clause_kind += "nogroup";
            break;
        case OMPC_map:
            clause_kind += "map";
            break;
        case OMPC_use_device_ptr:
            clause_kind += "use_device_ptr";
            break;
        case OMPC_use_device_addr:
            clause_kind += "use_device_addr";
            break;
        case OMPC_is_device_ptr:
            clause_kind += "is_device_ptr";
            break;
        case OMPC_has_device_addr:
            clause_kind += "has_device_addr";
            break;
        case OMPC_link:
            clause_kind += "link";
            break;
        case OMPC_device_type:
            clause_kind += "device_type";
            break;
        case OMPC_acq_rel:
            clause_kind += "acq_rel";
            break;
        case OMPC_release:
            clause_kind += "release";
            break;
        case OMPC_acquire:
            clause_kind += "acquire";
            break;
        case OMPC_read:
            clause_kind += "read";
            break;
        case OMPC_write:
            clause_kind += "write";
            break;
        case OMPC_update:
            clause_kind += "update";
            break;
        case OMPC_capture:
            clause_kind += "capture";
            break;
        case OMPC_seq_cst:
            clause_kind += "seq_cst";
            break;
        case OMPC_relaxed:
            clause_kind += "relaxed";
            break;
        case OMPC_hint:
            clause_kind += "hint";
            break;
        case OMPC_destroy:
            clause_kind += "destroy";
            break;
        case OMPC_threads:
            clause_kind += "threads";
            break;
        case OMPC_simd:
            clause_kind += "simd";
            break;
        case OMPC_uses_allocators:
            clause_kind += "uses_allocators";
            break;
        default:
            printf("The clause enum is not supported yet.\n");
    }
    //parent_node = parent_node.substr(0, parent_node.size()-1);
    std::string clause_label = clause_kind;
    clause_kind = parent_node + "_" + clause_kind + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_kind + " [label = \"" + clause_label + + "\"]\n";
    dot_file << current_line.c_str();

    if (this->getKind() == OMPC_default) {
        OpenMPDirective* variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_kind, "");
        };
    };

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + "expr" + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}